

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_parserInternals(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  undefined8 uVar27;
  xmlParserCtxtPtr pxVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 uVar33;
  undefined8 uVar34;
  int test_ret_6;
  uint *puVar35;
  int n_lang;
  uint uVar36;
  undefined4 *puVar37;
  ulong uVar38;
  undefined8 uVar39;
  undefined *puVar40;
  int n_val;
  uint uVar41;
  undefined8 *puVar42;
  int test_ret_5;
  int iVar43;
  uint uVar44;
  undefined4 uVar45;
  xmlChar *pxVar46;
  undefined **ppuVar47;
  char *pcVar48;
  int test_ret_13;
  uint uVar49;
  int *piVar50;
  int n_size;
  char *pcVar51;
  int test_ret_8;
  int test_ret;
  int test_ret_2;
  int test_ret_1;
  int test_ret_17;
  int test_ret_18;
  int test_ret_19;
  int test_ret_20;
  int local_84;
  undefined8 local_78;
  int local_70;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  if (quiet == '\0') {
    puts("Testing parserInternals : 28 of 75 functions ...");
  }
  puVar42 = &DAT_0015ad60;
  uVar36 = 0;
  iVar43 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar36 < 4) {
      uVar27 = *puVar42;
    }
    else {
      uVar27 = 0;
    }
    xmlCheckLanguageID(uVar27);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckLanguageID",(ulong)(uint)(iVar6 - iVar5));
      iVar43 = iVar43 + 1;
      printf(" %d",(ulong)uVar36);
      putchar(10);
    }
    uVar36 = uVar36 + 1;
    puVar42 = puVar42 + 1;
  } while (uVar36 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar36 = 0;
  do {
    local_78 = 0;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      uVar38 = 0;
      pxVar46 = (xmlChar *)0x0;
      if (bVar3) {
        pxVar46 = chartab;
      }
      puVar37 = &DAT_00158164;
      do {
        iVar6 = xmlMemBlocks();
        uVar45 = 0xffffffff;
        if (uVar36 < 4) {
          uVar45 = (&DAT_00158164)[uVar36];
        }
        xmlCopyChar(uVar45,pxVar46,*puVar37);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCopyChar",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar36);
          printf(" %d",local_78);
          printf(" %d",uVar38);
          putchar(10);
        }
        uVar41 = (int)uVar38 + 1;
        uVar38 = (ulong)uVar41;
        puVar37 = puVar37 + 1;
      } while (uVar41 != 4);
      local_78 = 1;
      bVar2 = false;
    } while (bVar3);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 4);
  function_tests = function_tests + 1;
  local_70 = 0;
  uVar36 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    pxVar46 = (xmlChar *)0x0;
    if (bVar3) {
      pxVar46 = chartab;
    }
    puVar37 = &DAT_00158164;
    uVar38 = 0;
    do {
      iVar6 = xmlMemBlocks();
      xmlCopyCharMultiByte(pxVar46,*puVar37);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyCharMultiByte",(ulong)(uint)(iVar7 - iVar6));
        local_70 = local_70 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d",uVar38);
        putchar(10);
      }
      uVar41 = (int)uVar38 + 1;
      uVar38 = (ulong)uVar41;
      puVar37 = puVar37 + 1;
    } while (uVar41 != 4);
    uVar36 = 1;
    bVar2 = false;
  } while (bVar3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar36 = 0;
  do {
    uVar38 = 0;
    do {
      puVar42 = &DAT_0015ad60;
      uVar41 = 0;
      do {
        iVar7 = xmlMemBlocks();
        if (uVar36 < 4) {
          uVar27 = (&DAT_0015ad60)[uVar36];
        }
        else {
          uVar27 = 0;
        }
        if ((uint)uVar38 < 4) {
          uVar39 = (&DAT_0015ad60)[uVar38];
        }
        else {
          uVar39 = 0;
        }
        if (uVar41 < 4) {
          uVar34 = *puVar42;
        }
        else {
          uVar34 = 0;
        }
        xmlCreateEntityParserCtxt(uVar27,uVar39,uVar34);
        xmlFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateEntityParserCtxt",(ulong)(uint)(iVar8 - iVar7)
                );
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar36);
          printf(" %d",uVar38);
          printf(" %d");
          putchar(10);
        }
        uVar41 = uVar41 + 1;
        puVar42 = puVar42 + 1;
      } while (uVar41 != 5);
      uVar41 = (uint)uVar38 + 1;
      uVar38 = (ulong)uVar41;
    } while (uVar41 != 5);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 5);
  function_tests = function_tests + 1;
  ppuVar47 = &PTR_anon_var_dwarf_674_0015ad20;
  uVar36 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar36 < 5) {
      puVar40 = *ppuVar47;
    }
    else {
      puVar40 = (undefined *)0x0;
    }
    xmlCreateFileParserCtxt(puVar40);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateFileParserCtxt",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",(ulong)uVar36);
      putchar(10);
    }
    uVar36 = uVar36 + 1;
    ppuVar47 = ppuVar47 + 1;
  } while (uVar36 != 6);
  function_tests = function_tests + 1;
  uVar36 = 0;
  iVar8 = 0;
  do {
    piVar50 = &DAT_00158164;
    uVar38 = 0;
    do {
      iVar9 = xmlMemBlocks();
      if (uVar36 == 0) {
        bVar2 = false;
        pcVar48 = "foo";
      }
      else if (uVar36 == 2) {
        bVar2 = false;
        pcVar48 = "test/ent2";
      }
      else if (uVar36 == 1) {
        bVar2 = false;
        pcVar48 = "<foo/>";
      }
      else {
        bVar2 = true;
        pcVar48 = (char *)0x0;
      }
      iVar11 = *piVar50;
      if ((!bVar2) && (iVar10 = xmlStrlen(pcVar48), iVar10 < iVar11)) {
        iVar11 = 0;
      }
      uVar27 = xmlCreateMemoryParserCtxt(pcVar48,iVar11);
      xmlFreeParserCtxt(uVar27);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar9 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateMemoryParserCtxt",(ulong)(uint)(iVar11 - iVar9))
        ;
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d",uVar38);
        putchar(10);
      }
      uVar41 = (int)uVar38 + 1;
      uVar38 = (ulong)uVar41;
      piVar50 = piVar50 + 1;
    } while (uVar41 != 4);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 4);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar36 = 0;
  do {
    puVar35 = &DAT_00158164;
    uVar41 = 0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar36 < 5) {
        puVar40 = (&PTR_anon_var_dwarf_674_0015ad20)[uVar36];
      }
      else {
        puVar40 = (undefined *)0x0;
      }
      pcVar48 = (char *)(ulong)*puVar35;
      xmlCreateURLParserCtxt(puVar40);
      xmlFreeParserCtxt();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar11 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateURLParserCtxt",(ulong)(uint)(iVar10 - iVar11));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar36);
        pcVar48 = (char *)(ulong)uVar41;
        printf(" %d");
        putchar(10);
      }
      uVar41 = uVar41 + 1;
      puVar35 = puVar35 + 1;
    } while (uVar41 != 4);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 6);
  function_tests = function_tests + 1;
  uVar36 = 0;
  iVar11 = 0;
  do {
    iVar10 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(uVar36,(int)pcVar48);
    xmlCtxtErrMemory(pxVar28);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar10 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtErrMemory",(ulong)(uint)(iVar12 - iVar10));
      iVar11 = iVar11 + 1;
      pcVar48 = (char *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  uVar36 = 0;
  iVar10 = 0;
  do {
    iVar12 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(uVar36,(int)pcVar48);
    uVar27 = xmlCtxtPopInput(pxVar28);
    xmlFreeInputStream(uVar27);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtPopInput",(ulong)(uint)(iVar13 - iVar12));
      iVar10 = iVar10 + 1;
      pcVar48 = (char *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  local_84 = 0;
  iVar12 = 0;
  do {
    iVar14 = (int)pcVar48;
    iVar13 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(iVar12,iVar14);
    pcVar48 = (char *)0x0;
    xmlCtxtPushInput(pxVar28);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtPushInput",(ulong)(uint)(iVar14 - iVar13));
      local_84 = local_84 + 1;
      printf(" %d");
      pcVar48 = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar12 = iVar12 + 1;
  } while (iVar12 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar36 = 0;
  do {
    pcVar51 = (char *)0x0;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      iVar14 = (int)pcVar48;
      iVar13 = xmlMemBlocks();
      pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar14);
      pcVar48 = (char *)0x0;
      if (bVar3) {
        pcVar48 = (char *)0x15d404;
      }
      xmlCurrentChar(pxVar28);
      call_tests = call_tests + 1;
      if (pxVar28 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar28);
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCurrentChar",(ulong)(uint)(iVar14 - iVar13));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        pcVar48 = pcVar51;
      }
      pcVar51 = (char *)0x1;
      bVar2 = false;
    } while (bVar3);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  puVar37 = &DAT_00158164;
  uVar36 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    xmlIsLetter(*puVar37);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsLetter",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      pcVar48 = (char *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
    uVar36 = uVar36 + 1;
    puVar37 = puVar37 + 1;
  } while (uVar36 != 4);
  function_tests = function_tests + 1;
  iVar15 = 0;
  iVar14 = 0;
  do {
    iVar17 = (int)pcVar48;
    iVar16 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(iVar14,iVar17);
    pcVar48 = (char *)0x0;
    uVar27 = xmlNewEntityInputStream(pxVar28);
    xmlFreeInputStream(uVar27);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewEntityInputStream",(ulong)(uint)(iVar17 - iVar16));
      iVar15 = iVar15 + 1;
      printf(" %d");
      pcVar48 = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != 3);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar36 = 0;
  do {
    puVar42 = &DAT_0015ad80;
    pcVar51 = (char *)0x0;
    do {
      iVar17 = (int)pcVar48;
      iVar16 = xmlMemBlocks();
      pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar17);
      uVar41 = (uint)pcVar51;
      if (uVar41 < 7) {
        pcVar48 = (char *)*puVar42;
      }
      else {
        pcVar48 = (char *)0x0;
      }
      uVar27 = xmlNewInputFromFile(pxVar28);
      xmlFreeInputStream(uVar27);
      call_tests = call_tests + 1;
      if (pxVar28 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar28);
      }
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewInputFromFile",(ulong)(uint)(iVar17 - iVar16));
        iVar14 = iVar14 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        pcVar48 = pcVar51;
      }
      uVar41 = uVar41 + 1;
      pcVar51 = (char *)(ulong)uVar41;
      puVar42 = puVar42 + 1;
    } while (uVar41 != 8);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  uVar36 = 0;
  iVar16 = 0;
  do {
    iVar17 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(uVar36,(int)pcVar48);
    uVar27 = xmlNewInputStream(pxVar28);
    xmlFreeInputStream(uVar27);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewInputStream",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      pcVar48 = (char *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar36 = 0;
  do {
    puVar42 = &DAT_0015ad60;
    pcVar51 = (char *)0x0;
    do {
      iVar19 = (int)pcVar48;
      iVar18 = xmlMemBlocks();
      pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar19);
      uVar41 = (uint)pcVar51;
      if (uVar41 < 4) {
        pcVar48 = (char *)*puVar42;
      }
      else {
        pcVar48 = (char *)0x0;
      }
      uVar27 = xmlNewStringInputStream(pxVar28);
      xmlFreeInputStream(uVar27);
      call_tests = call_tests + 1;
      if (pxVar28 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar28);
      }
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      if (iVar18 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewStringInputStream",(ulong)(uint)(iVar19 - iVar18));
        iVar17 = iVar17 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        pcVar48 = pcVar51;
      }
      uVar41 = uVar41 + 1;
      pcVar51 = (char *)(ulong)uVar41;
      puVar42 = puVar42 + 1;
    } while (uVar41 != 5);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  uVar36 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(uVar36,(int)pcVar48);
    xmlNextChar(pxVar28);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextChar",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      pcVar48 = (char *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  iVar19 = xmlMemBlocks();
  xmlParserInputShrink(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar19 != iVar20) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserInputShrink");
    pcVar48 = (char *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar36 = 0;
  iVar1 = 0;
  do {
    iVar21 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(uVar36,(int)pcVar48);
    xmlPopInput(pxVar28);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPopInput",(ulong)(uint)(iVar22 - iVar21));
      iVar1 = iVar1 + 1;
      pcVar48 = (char *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  iVar21 = 0;
  iVar22 = 0;
  do {
    iVar24 = (int)pcVar48;
    iVar23 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(iVar22,iVar24);
    pcVar48 = (char *)0x0;
    xmlPushInput(pxVar28);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPushInput",(ulong)(uint)(iVar24 - iVar23));
      iVar21 = iVar21 + 1;
      printf(" %d");
      pcVar48 = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar22 = iVar22 + 1;
  } while (iVar22 != 3);
  function_tests = function_tests + 1;
  local_60 = 0;
  uVar36 = 0;
  do {
    puVar42 = &DAT_0015ad60;
    uVar41 = 0;
    do {
      iVar23 = (int)pcVar48;
      iVar22 = xmlMemBlocks();
      pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar23);
      if (uVar41 < 4) {
        pcVar48 = (char *)*puVar42;
      }
      else {
        pcVar48 = (char *)0x0;
      }
      lVar29 = xmlSplitQName(pxVar28,pcVar48,0);
      if (lVar29 != 0) {
        (*_xmlFree)(lVar29);
      }
      call_tests = call_tests + 1;
      if (pxVar28 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar28);
      }
      xmlResetLastError();
      iVar23 = xmlMemBlocks();
      if (iVar22 != iVar23) {
        iVar23 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSplitQName",(ulong)(uint)(iVar23 - iVar22));
        local_60 = local_60 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        pcVar48 = (char *)0x0;
        printf(" %d");
        putchar(10);
      }
      uVar41 = uVar41 + 1;
      puVar42 = puVar42 + 1;
    } while (uVar41 != 5);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  local_5c = 0;
  uVar36 = 0;
  do {
    uVar38 = 0;
    do {
      pcVar51 = (char *)0x0;
      bVar2 = true;
      do {
        bVar3 = bVar2;
        iVar23 = (int)pcVar48;
        iVar22 = xmlMemBlocks();
        pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar23);
        if ((uint)uVar38 < 4) {
          pcVar48 = (char *)(&DAT_0015ad60)[uVar38];
        }
        else {
          pcVar48 = (char *)0x0;
        }
        uVar27 = 0;
        if (bVar3) {
          uVar27 = 0x15d408;
        }
        xmlStringCurrentChar(pxVar28,pcVar48,uVar27);
        call_tests = call_tests + 1;
        if (pxVar28 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar28);
        }
        xmlResetLastError();
        iVar23 = xmlMemBlocks();
        if (iVar22 != iVar23) {
          iVar23 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStringCurrentChar",(ulong)(uint)(iVar23 - iVar22));
          local_5c = local_5c + 1;
          printf(" %d",(ulong)uVar36);
          printf(" %d",uVar38);
          printf(" %d");
          putchar(10);
          pcVar48 = pcVar51;
        }
        pcVar51 = (char *)0x1;
        bVar2 = false;
      } while (bVar3);
      uVar41 = (uint)uVar38 + 1;
      uVar38 = (ulong)uVar41;
    } while (uVar41 != 5);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  local_58 = 0;
  uVar36 = 0;
  do {
    uVar38 = 0;
    do {
      uVar31 = 0;
      do {
        uVar32 = 0;
        do {
          uVar41 = 0xf82061 >> ((char)uVar32 * '\b' & 0x1fU);
          if (2 < (uint)uVar32) {
            uVar41 = 0;
          }
          uVar30 = 0;
          do {
            uVar33 = (char)(0xf82061 >> ((char)uVar30 * '\b' & 0x1fU));
            if (2 < (uint)uVar30) {
              uVar33 = 0;
            }
            pcVar51 = (char *)0x0;
            do {
              iVar23 = (int)pcVar48;
              iVar22 = xmlMemBlocks();
              pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar23);
              if ((uint)uVar38 < 4) {
                pcVar48 = (char *)(&DAT_0015ad60)[uVar38];
              }
              else {
                pcVar48 = (char *)0x0;
              }
              uVar45 = 0xffffffff;
              if ((uint)uVar31 < 4) {
                uVar45 = (&DAT_00158164)[uVar31];
              }
              uVar44 = (uint)pcVar51;
              uVar4 = (undefined1)(0xf82061 >> ((char)pcVar51 * '\b' & 0x1fU));
              if (2 < uVar44) {
                uVar4 = 0;
              }
              lVar29 = xmlStringDecodeEntities(pxVar28,pcVar48,uVar45,uVar41 & 0xff,uVar33,uVar4);
              if (lVar29 != 0) {
                (*_xmlFree)(lVar29);
              }
              call_tests = call_tests + 1;
              if (pxVar28 != (xmlParserCtxtPtr)0x0) {
                xmlFreeParserCtxt(pxVar28);
              }
              xmlResetLastError();
              iVar23 = xmlMemBlocks();
              if (iVar22 != iVar23) {
                iVar23 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlStringDecodeEntities",
                       (ulong)(uint)(iVar23 - iVar22));
                local_58 = local_58 + 1;
                printf(" %d",(ulong)uVar36);
                printf(" %d",uVar38);
                printf(" %d",uVar31);
                printf(" %d",uVar32);
                printf(" %d",uVar30);
                printf(" %d");
                putchar(10);
                pcVar48 = pcVar51;
              }
              uVar44 = uVar44 + 1;
              pcVar51 = (char *)(ulong)uVar44;
            } while (uVar44 != 4);
            uVar44 = (uint)uVar30 + 1;
            uVar30 = (ulong)uVar44;
          } while (uVar44 != 4);
          uVar41 = (uint)uVar32 + 1;
          uVar32 = (ulong)uVar41;
        } while (uVar41 != 4);
        uVar41 = (uint)uVar31 + 1;
        uVar31 = (ulong)uVar41;
      } while (uVar41 != 4);
      uVar41 = (uint)uVar38 + 1;
      uVar38 = (ulong)uVar41;
    } while (uVar41 != 5);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  local_54 = 0;
  uVar36 = 0;
  do {
    uVar38 = 0;
    do {
      uVar41 = 0;
      do {
        uVar44 = 0;
        do {
          uVar31 = 0;
          do {
            uVar33 = (undefined1)(0xf82061 >> ((char)uVar31 * '\b' & 0x1fU));
            if (2 < (uint)uVar31) {
              uVar33 = 0;
            }
            uVar32 = 0;
            do {
              uVar4 = (undefined1)(0xf82061 >> ((char)uVar32 * '\b' & 0x1fU));
              pcVar51 = (char *)0x0;
              if (2 < (uint)uVar32) {
                uVar4 = 0;
              }
              do {
                iVar23 = (int)pcVar48;
                iVar22 = xmlMemBlocks();
                pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar23);
                switch(uVar38) {
                case 0:
                  bVar2 = false;
                  pcVar48 = "foo";
                  break;
                case 1:
                  bVar2 = false;
                  pcVar48 = "<foo/>";
                  break;
                case 2:
                  bVar2 = false;
                  pcVar48 = anon_var_dwarf_194;
                  break;
                case 3:
                  bVar2 = false;
                  pcVar48 = " 2ab ";
                  break;
                default:
                  bVar2 = true;
                  pcVar48 = (char *)0x0;
                }
                uVar45 = 0xffffffff;
                iVar23 = -1;
                if (uVar41 < 4) {
                  iVar23 = (&DAT_00158164)[uVar41];
                }
                if (uVar44 < 4) {
                  uVar45 = (&DAT_00158164)[uVar44];
                }
                uVar49 = (uint)pcVar51;
                uVar25 = 0xf82061 >> ((char)pcVar51 * '\b' & 0x1fU);
                if (2 < uVar49) {
                  uVar25 = 0;
                }
                if ((!bVar2) && (iVar24 = xmlStrlen(pcVar48), iVar24 < iVar23)) {
                  iVar23 = 0;
                }
                lVar29 = xmlStringLenDecodeEntities
                                   (pxVar28,pcVar48,iVar23,uVar45,uVar33,uVar4,uVar25 & 0xff);
                if (lVar29 != 0) {
                  (*_xmlFree)(lVar29);
                }
                call_tests = call_tests + 1;
                if (pxVar28 != (xmlParserCtxtPtr)0x0) {
                  xmlFreeParserCtxt(pxVar28);
                }
                xmlResetLastError();
                iVar23 = xmlMemBlocks();
                if (iVar22 != iVar23) {
                  iVar23 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlStringLenDecodeEntities",
                         (ulong)(uint)(iVar23 - iVar22));
                  local_54 = local_54 + 1;
                  printf(" %d",(ulong)uVar36);
                  printf(" %d",uVar38);
                  printf(" %d",(ulong)uVar41);
                  printf(" %d",(ulong)uVar44);
                  printf(" %d",uVar31);
                  printf(" %d",uVar32);
                  printf(" %d");
                  putchar(10);
                  pcVar48 = pcVar51;
                }
                uVar49 = uVar49 + 1;
                pcVar51 = (char *)(ulong)uVar49;
              } while (uVar49 != 4);
              uVar25 = (uint)uVar32 + 1;
              uVar32 = (ulong)uVar25;
            } while (uVar25 != 4);
            uVar25 = (uint)uVar31 + 1;
            uVar31 = (ulong)uVar25;
          } while (uVar25 != 4);
          uVar44 = uVar44 + 1;
        } while (uVar44 != 4);
        uVar41 = uVar41 + 1;
      } while (uVar41 != 4);
      uVar41 = (int)uVar38 + 1;
      uVar38 = (ulong)uVar41;
    } while (uVar41 != 5);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  iVar22 = 0;
  uVar36 = 0;
  do {
    puVar35 = &DAT_0014c234;
    pcVar51 = (char *)0x0;
    do {
      iVar24 = (int)pcVar48;
      iVar23 = xmlMemBlocks();
      pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar24);
      pcVar48 = (char *)0xffffffff;
      uVar41 = (uint)pcVar51;
      if (uVar41 < 3) {
        pcVar48 = (char *)(ulong)*puVar35;
      }
      xmlSwitchEncoding(pxVar28);
      call_tests = call_tests + 1;
      if (pxVar28 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar28);
      }
      xmlResetLastError();
      iVar24 = xmlMemBlocks();
      if (iVar23 != iVar24) {
        iVar24 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSwitchEncoding",(ulong)(uint)(iVar24 - iVar23));
        iVar22 = iVar22 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        pcVar48 = pcVar51;
      }
      uVar41 = uVar41 + 1;
      pcVar51 = (char *)(ulong)uVar41;
      puVar35 = puVar35 + 1;
    } while (uVar41 != 4);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  iVar23 = 0;
  uVar36 = 0;
  do {
    puVar42 = &DAT_0015ad48;
    pcVar51 = (char *)0x0;
    do {
      iVar26 = (int)pcVar48;
      iVar24 = xmlMemBlocks();
      pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar26);
      uVar41 = (uint)pcVar51;
      if (uVar41 < 3) {
        pcVar48 = (char *)*puVar42;
      }
      else {
        pcVar48 = (char *)0x0;
      }
      xmlSwitchEncodingName(pxVar28);
      call_tests = call_tests + 1;
      if (pxVar28 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar28);
      }
      xmlResetLastError();
      iVar26 = xmlMemBlocks();
      if (iVar24 != iVar26) {
        iVar26 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSwitchEncodingName",(ulong)(uint)(iVar26 - iVar24));
        iVar23 = iVar23 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        pcVar48 = pcVar51;
      }
      uVar41 = uVar41 + 1;
      pcVar51 = (char *)(ulong)uVar41;
      puVar42 = puVar42 + 1;
    } while (uVar41 != 4);
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  local_54 = local_84 + iVar12 +
             iVar6 + iVar7 + iVar5 + iVar43 + local_70 + iVar8 + iVar9 + iVar11 + iVar10 + iVar13 +
             iVar15 + iVar14 + iVar16 + iVar17 + iVar18 + (uint)(iVar19 != iVar20) + iVar1 + iVar21
             + local_60 + local_5c + local_58 + local_54;
  function_tests = function_tests + 1;
  iVar43 = 0;
  uVar36 = 0;
  do {
    iVar5 = local_54;
    iVar6 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar5);
    xmlSwitchInputEncoding(pxVar28,0,0);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar6 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSwitchInputEncoding",(ulong)(uint)(iVar5 - iVar6));
      iVar43 = iVar43 + 1;
      printf(" %d",(ulong)uVar36);
      printf(" %d",0);
      printf(" %d",0);
      putchar(10);
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  local_54 = local_54 + iVar22;
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar36 = 0;
  do {
    iVar6 = local_54;
    iVar7 = xmlMemBlocks();
    pxVar28 = gen_xmlParserCtxtPtr(uVar36,iVar6);
    xmlSwitchToEncoding(pxVar28,0);
    call_tests = call_tests + 1;
    if (pxVar28 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar28);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar7 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSwitchToEncoding",(ulong)(uint)(iVar6 - iVar7));
      iVar5 = iVar5 + 1;
      printf(" %d",(ulong)uVar36);
      printf(" %d",0);
      putchar(10);
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != 3);
  function_tests = function_tests + 1;
  iVar5 = local_54 + iVar23 + iVar43 + iVar5;
  if (iVar5 != 0) {
    printf("Module parserInternals: %d errors\n");
  }
  return iVar5;
}

Assistant:

static int
test_parserInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parserInternals : 28 of 75 functions ...\n");
    test_ret += test_xmlCheckLanguageID();
    test_ret += test_xmlCopyChar();
    test_ret += test_xmlCopyCharMultiByte();
    test_ret += test_xmlCreateEntityParserCtxt();
    test_ret += test_xmlCreateFileParserCtxt();
    test_ret += test_xmlCreateMemoryParserCtxt();
    test_ret += test_xmlCreateURLParserCtxt();
    test_ret += test_xmlCtxtErrMemory();
    test_ret += test_xmlCtxtPopInput();
    test_ret += test_xmlCtxtPushInput();
    test_ret += test_xmlCurrentChar();
    test_ret += test_xmlIsLetter();
    test_ret += test_xmlNewEntityInputStream();
    test_ret += test_xmlNewInputFromFile();
    test_ret += test_xmlNewInputStream();
    test_ret += test_xmlNewStringInputStream();
    test_ret += test_xmlNextChar();
    test_ret += test_xmlParserInputShrink();
    test_ret += test_xmlPopInput();
    test_ret += test_xmlPushInput();
    test_ret += test_xmlSplitQName();
    test_ret += test_xmlStringCurrentChar();
    test_ret += test_xmlStringDecodeEntities();
    test_ret += test_xmlStringLenDecodeEntities();
    test_ret += test_xmlSwitchEncoding();
    test_ret += test_xmlSwitchEncodingName();
    test_ret += test_xmlSwitchInputEncoding();
    test_ret += test_xmlSwitchToEncoding();

    if (test_ret != 0)
	printf("Module parserInternals: %d errors\n", test_ret);
    return(test_ret);
}